

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::Greater(VirtualMachine *this)

{
  element_type *peVar1;
  VariableType VVar2;
  bool val;
  Variable VVar3;
  Variable VVar4;
  
  VVar3 = popOpStack(this);
  VVar2 = VVar3.type;
  VVar4 = popOpStack(this);
  if (VVar4.type == VVar2) {
    if (VVar2 == Float) {
      val = VVar3.field_1.doubleValue < VVar4.field_1.doubleValue;
    }
    else {
      if (VVar2 != Integer) goto LAB_001181fe;
      val = VVar3.field_1.integerValue < VVar4.field_1.integerValue;
    }
    pushBoolean(this,val);
  }
  else {
LAB_001181fe:
    pushUndefined(this);
  }
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Greater() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (!this->protectDifferentTypes(first, second)) {
    this->advance();
    return;
  }

  if (first.type == VariableType::Integer) {
    this->pushBoolean(first.integerValue > second.integerValue);

  } else if (first.type == VariableType::Float) {
    this->pushBoolean(first.doubleValue > second.doubleValue);

  } else {
    this->pushUndefined();
  }
  this->advance();
}